

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_time.c
# Opt level: O0

int amqp_time_from_now(amqp_time_t *time,timeval *timeout)

{
  amqp_time_t aVar1;
  ulong uVar2;
  uint64_t uVar3;
  long *in_RSI;
  ulong *in_RDI;
  uint64_t delta_ns;
  uint64_t now_ns;
  int local_4;
  
  if (in_RSI == (long *)0x0) {
    aVar1 = amqp_time_infinite();
    *in_RDI = aVar1.time_point_ns;
    local_4 = 0;
  }
  else if ((*in_RSI < 0) || (in_RSI[1] < 0)) {
    local_4 = -10;
  }
  else {
    uVar2 = *in_RSI * 1000000000 + in_RSI[1] * 1000;
    uVar3 = amqp_get_monotonic_timestamp();
    if (uVar3 == 0) {
      local_4 = -0xe;
    }
    else {
      *in_RDI = uVar3 + uVar2;
      if ((*in_RDI < uVar3) || (*in_RDI < uVar2)) {
        local_4 = -10;
      }
      else {
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

int amqp_time_from_now(amqp_time_t *time, const struct timeval *timeout) {
  uint64_t now_ns;
  uint64_t delta_ns;

  assert(NULL != time);

  if (NULL == timeout) {
    *time = amqp_time_infinite();
    return AMQP_STATUS_OK;
  }

  if (timeout->tv_sec < 0 || timeout->tv_usec < 0) {
    return AMQP_STATUS_INVALID_PARAMETER;
  }

  delta_ns = (uint64_t)timeout->tv_sec * AMQP_NS_PER_S +
             (uint64_t)timeout->tv_usec * AMQP_NS_PER_US;

  now_ns = amqp_get_monotonic_timestamp();
  if (0 == now_ns) {
    return AMQP_STATUS_TIMER_FAILURE;
  }

  time->time_point_ns = now_ns + delta_ns;
  if (now_ns > time->time_point_ns || delta_ns > time->time_point_ns) {
    return AMQP_STATUS_INVALID_PARAMETER;
  }

  return AMQP_STATUS_OK;
}